

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O3

void calc<double>(options2 *opt)

{
  string *psVar1;
  fvar<double,_2UL> beta;
  long lVar2;
  char cVar3;
  int iVar4;
  int *piVar5;
  long *plVar6;
  ostream *poVar7;
  invalid_argument *this;
  undefined8 uVar8;
  int iVar9;
  char *pcVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> b0;
  fvar<double,_2UL> f;
  char local_a1;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  fvar<double,_2UL> local_70;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  pcVar10 = (opt->Jx)._M_dataplus._M_p;
  piVar5 = __errno_location();
  iVar4 = *piVar5;
  *piVar5 = 0;
  dVar11 = strtod(pcVar10,(char **)&local_70);
  if ((char *)local_70.v._M_elems[0] == pcVar10) {
    std::__throw_invalid_argument("stod");
LAB_001296b0:
    std::__throw_invalid_argument("stod");
  }
  else {
    iVar9 = *piVar5;
    local_90 = dVar11;
    if (iVar9 == 0) {
LAB_00129218:
      *piVar5 = iVar4;
      iVar9 = iVar4;
    }
    else if (iVar9 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_00129218;
    }
    pcVar10 = (opt->Jy)._M_dataplus._M_p;
    *piVar5 = 0;
    dVar11 = strtod(pcVar10,(char **)&local_70);
    if ((char *)local_70.v._M_elems[0] == pcVar10) goto LAB_001296b0;
    local_98 = dVar11;
    if (*piVar5 == 0) {
LAB_0012925f:
      *piVar5 = iVar9;
    }
    else if (*piVar5 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_0012925f;
    }
    psVar1 = &opt->Tmin;
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 == 0) {
LAB_001292ce:
      dVar11 = ising::tc::square<double>(local_90,local_98);
      dVar12 = dVar11;
      dVar13 = dVar11;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) goto LAB_001292ce;
      pcVar10 = (psVar1->_M_dataplus)._M_p;
      iVar4 = *piVar5;
      *piVar5 = 0;
      dVar11 = strtod(pcVar10,(char **)&local_70);
      if ((char *)local_70.v._M_elems[0] == pcVar10) {
        std::__throw_invalid_argument("stod");
LAB_00129736:
        std::__throw_invalid_argument("stod");
LAB_00129742:
        uVar8 = std::__throw_invalid_argument("stod");
        __cxa_free_exception(piVar5);
        _Unwind_Resume(uVar8);
      }
      iVar9 = *piVar5;
      local_a0 = dVar11;
      if (iVar9 == 0) {
        *piVar5 = iVar4;
      }
      else {
        iVar4 = iVar9;
        if (iVar9 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_001292ce;
        }
      }
      pcVar10 = (opt->Tmax)._M_dataplus._M_p;
      *piVar5 = 0;
      dVar11 = strtod(pcVar10,(char **)&local_70);
      if ((char *)local_70.v._M_elems[0] == pcVar10) goto LAB_00129736;
      iVar9 = *piVar5;
      local_88 = dVar11;
      if (iVar9 == 0) {
LAB_00129336:
        *piVar5 = iVar4;
        iVar9 = iVar4;
      }
      else if (iVar9 == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_00129336;
      }
      pcVar10 = (opt->dT)._M_dataplus._M_p;
      *piVar5 = 0;
      dVar11 = strtod(pcVar10,(char **)&local_70);
      if ((char *)local_70.v._M_elems[0] == pcVar10) goto LAB_00129742;
      dVar12 = local_a0;
      dVar13 = local_88;
      if (*piVar5 == 0) {
LAB_00129384:
        *piVar5 = iVar9;
      }
      else if (*piVar5 == 0x22) {
        dVar11 = (double)std::__throw_out_of_range("stod");
        goto LAB_00129384;
      }
    }
    lVar2 = std::cout;
    if ((0.0 <= dVar13) && (0.0 <= dVar12)) {
      if (dVar13 < dVar12) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
      }
      else {
        local_a0 = dVar12;
        local_88 = dVar13;
        local_58 = dVar11;
        if (0.0 < dVar11) {
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
               0x100;
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) =
               0xf;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# lattice: square\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# precision: ",0xd);
          plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,0xf);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          poVar7 = (ostream *)std::ostream::flush();
          pcVar10 = "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n",0x20);
          local_50 = local_58 * 0.0001 + local_88;
          if (local_a0 < local_50) {
            do {
              local_88 = 1.0 / local_a0;
              uStack_80 = 0;
              uStack_40 = 0x3ff0000000000000;
              uStack_38 = 0;
              beta.v._M_elems[1] = 1.0;
              beta.v._M_elems[0] = local_88;
              beta.v._M_elems[2] = 0.0;
              local_48 = local_88;
              ising::free_energy::square::
              infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                        (&local_70,(square *)pcVar10,local_90,local_98,beta);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"inf inf ",8)
              ;
              poVar7 = std::ostream::_M_insert<double>(local_90);
              local_a1 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_a1,1);
              poVar7 = std::ostream::_M_insert<double>(local_98);
              local_a1 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_a1,1);
              poVar7 = std::ostream::_M_insert<double>(local_a0);
              local_a1 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_a1,1);
              poVar7 = std::ostream::_M_insert<double>(local_88);
              local_a1 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_a1,1);
              poVar7 = std::ostream::_M_insert<double>(local_70.v._M_elems[0]);
              local_a1 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_a1,1);
              poVar7 = std::ostream::_M_insert<double>
                                 (local_70.v._M_elems[1] * local_88 + local_70.v._M_elems[0]);
              local_a1 = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_a1,1);
              poVar7 = std::ostream::_M_insert<double>
                                 (-local_88 * local_88 *
                                  (local_70.v._M_elems[1] + local_70.v._M_elems[1] +
                                  (local_70.v._M_elems[2] + local_70.v._M_elems[2]) * local_88));
              cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7)
              ;
              pcVar10 = (char *)(ulong)(uint)(int)cVar3;
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              local_a0 = local_a0 + local_58;
            } while (local_a0 < local_50);
          }
          return;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"dT should be positive");
      }
      goto LAB_00129714;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Temperature should be positive");
LAB_00129714:
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << (1 / t)
              << ' ' << free_energy(f, beta) << ' ' << energy(f, beta) << ' '
              << specific_heat(f, beta) << std::endl;
  }
}